

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

void flatbuffers::GenComment
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *dc,string *code_ptr,CommentConfig *config,char *prefix)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  string line_prefix;
  allocator<char> local_ea;
  allocator<char> local_e9;
  CommentConfig *local_e8;
  char *local_e0;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((dc->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (dc->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_e8 = config;
    local_e0 = prefix;
    local_d8 = code_ptr;
    if ((config != (CommentConfig *)0x0) && (config->first_line != (char *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,prefix,(allocator<char> *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_e8->first_line,&local_ea);
      std::operator+(&local_d0,&local_b0,&local_90);
      std::operator+(&local_70,&local_d0,"\n");
      std::__cxx11::string::append((string *)local_d8);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,local_e0,(allocator<char> *)&local_b0);
    if (local_e8 == (CommentConfig *)0x0) {
      __rhs = "///";
    }
    else {
      __rhs = "///";
      if (local_e8->content_line_prefix != (char *)0x0) {
        __rhs = local_e8->content_line_prefix;
      }
    }
    std::operator+(&local_70,&local_d0,__rhs);
    std::__cxx11::string::~string((string *)&local_d0);
    for (__rhs_00 = (dc->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        __rhs_00 !=
        (dc->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish; __rhs_00 = __rhs_00 + 1) {
      std::operator+(&local_b0,&local_70,__rhs_00);
      std::operator+(&local_d0,&local_b0,"\n");
      std::__cxx11::string::append((string *)local_d8);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if ((local_e8 != (CommentConfig *)0x0) && (local_e8->last_line != (char *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_e0,&local_ea);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,local_e8->last_line,&local_e9);
      std::operator+(&local_b0,&local_90,&local_50);
      std::operator+(&local_d0,&local_b0,"\n");
      std::__cxx11::string::append((string *)local_d8);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void GenComment(const std::vector<std::string> &dc, std::string *code_ptr,
                const CommentConfig *config, const char *prefix) {
  if (dc.begin() == dc.end()) {
    // Don't output empty comment blocks with 0 lines of comment content.
    return;
  }

  std::string &code = *code_ptr;
  if (config != nullptr && config->first_line != nullptr) {
    code += std::string(prefix) + std::string(config->first_line) + "\n";
  }
  std::string line_prefix =
      std::string(prefix) +
      ((config != nullptr && config->content_line_prefix != nullptr)
           ? config->content_line_prefix
           : "///");
  for (auto it = dc.begin(); it != dc.end(); ++it) {
    code += line_prefix + *it + "\n";
  }
  if (config != nullptr && config->last_line != nullptr) {
    code += std::string(prefix) + std::string(config->last_line) + "\n";
  }
}